

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl.c
# Opt level: O2

int param_copy(EVP_PKEY *to,EVP_PKEY *from)

{
  EVP_PKEY_ASN1_METHOD *pEVar1;
  undefined8 uVar2;
  ENGINE *pEVar3;
  undefined8 *puVar4;
  char *pcVar5;
  void *__dest;
  
  puVar4 = (undefined8 *)calloc(1,0x28);
  uVar2 = *(undefined8 *)&to->references;
  pEVar1 = to->ameth;
  pEVar3 = to->engine;
  *puVar4 = *(undefined8 *)to;
  puVar4[1] = uVar2;
  puVar4[2] = pEVar1;
  puVar4[3] = pEVar3;
  *(_union_271 *)(puVar4 + 4) = to->pkey;
  if (*(int *)(puVar4 + 1) == 0x6d) {
    pEVar1 = to->ameth;
    __dest = malloc((size_t)pEVar1);
    puVar4[3] = __dest;
    memcpy(__dest,to->engine,(size_t)pEVar1);
  }
  else if (*(int *)(puVar4 + 1) == 0x7a) {
    pcVar5 = strdup((char *)to->ameth);
    puVar4[2] = pcVar5;
  }
  return (int)puVar4;
}

Assistant:

thecl_param_t*
param_copy(
    thecl_param_t* param
) {
    thecl_param_t* copy = calloc(1, sizeof(thecl_param_t));
    memcpy(copy, param, sizeof(thecl_param_t));
    /* Handle possible pointers in the value. */
    if (copy->value.type == 'z')
        copy->value.val.z = strdup(param->value.val.z);
    else if (copy->value.type == 'm') {
        copy->value.val.m.data = malloc(param->value.val.m.length);
        memcpy(copy->value.val.m.data, param->value.val.m.data, param->value.val.m.length);
    }
    return copy;
}